

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O1

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  char cVar1;
  pointer pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer pbVar3;
  pointer pcVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  undefined8 uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  bool bVar16;
  string item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string line;
  string section;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  undefined1 local_1c8 [17];
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [12];
  uint local_17c;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_140;
  int local_134;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  uint local_114;
  string local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pointer local_d0;
  pointer local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_f0._M_allocated_capacity = (size_type)&local_e0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"default","");
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar5 = this->arrayStart;
  local_c0.field_2._M_allocated_capacity._4_4_ = SEXT14(cVar5);
  cVar1 = this->arrayEnd;
  if (cVar1 == ']' && cVar5 == '[') {
    local_17c._0_1_ = this->arraySeparator == ',';
    local_17c._1_3_ = (int3)(cVar5 >> 7);
  }
  else {
    local_17c._0_1_ = false;
    local_17c._1_3_ = 0;
  }
  local_134 = (int)cVar1;
  bVar16 = (local_c0.field_2._M_allocated_capacity._4_4_ & 0xdf) == 0;
  local_114 = (uint)(byte)this->arraySeparator;
  uVar12 = 0x2c;
  if (this->arraySeparator != 0x20) {
    uVar12 = local_114;
  }
  if (bVar16 && cVar5 == cVar1) {
    local_c0.field_2._M_allocated_capacity._4_4_ = 0x5b;
    local_134 = 0x5d;
    local_114 = uVar12;
  }
  local_17c = CONCAT31(local_17c._1_3_,local_17c._0_1_ | (bVar16 && cVar5 == cVar1));
  local_140 = __return_storage_ptr__;
  local_c0.field_2._8_8_ = this;
  do {
    paVar15 = &local_178.field_2;
    cVar5 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + (char)input);
    piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)&local_110,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      iVar6 = ::std::__cxx11::string::compare(local_f0._M_local_buf);
      if (iVar6 != 0) {
        local_178._M_string_length = 0;
        local_178.field_2._M_local_buf[0] = '\0';
        local_178._M_dataplus._M_p = (pointer)paVar15;
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1a8,(string *)&local_f0,&local_178);
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_1c8._0_8_ =
             pCVar2[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1c8._8_8_ =
             pCVar2[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        unique0x10000d0f =
             pCVar2[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pCVar2[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8._M_allocated_capacity;
        pCVar2[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1a8._8_8_;
        pCVar2[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_198._M_allocated_capacity;
        local_1a8._M_allocated_capacity = 0;
        local_1a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_198._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1a8);
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pCVar2[-1].name,0,(char *)pCVar2[-1].name._M_string_length,0x16fe41);
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar10 = (long)pCVar2[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pCVar2[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        while (0x20 < uVar10) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (__return_storage_ptr__,pCVar2 + -1);
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pbVar3 = pCVar2[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pCVar2[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
          pcVar4 = pbVar3[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar3[-1].field_2) {
            operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
          }
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar10 = (long)pCVar2[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pCVar2[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar15) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_allocated_capacity != &local_e0) {
        operator_delete((void *)local_f0._M_allocated_capacity,local_e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      return __return_storage_ptr__;
    }
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_1c8._0_8_ = local_110._M_dataplus._M_p + local_110._M_string_length;
    local_1a8._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
    local_178._M_dataplus._M_p = (pointer)paVar15;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_130,local_1c8,&local_1a8);
    local_110._M_string_length =
         (long)local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - (long)local_110._M_dataplus._M_p;
    *(char *)local_130.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start = '\0';
    _Var8 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      ();
    if (local_110._M_dataplus._M_p + local_110._M_string_length == _Var8._M_current) {
      local_110._M_string_length = 0;
      *local_110._M_dataplus._M_p = '\0';
    }
    else {
      ::std::__cxx11::string::_M_erase((ulong)&local_110,0);
    }
    if (((local_110._M_string_length < 2) || (*local_110._M_dataplus._M_p != '[')) ||
       (local_110._M_dataplus._M_p[local_110._M_string_length - 1] != ']')) {
      if (((local_110._M_string_length != 0) && (cVar5 = *local_110._M_dataplus._M_p, cVar5 != '#'))
         && ((cVar5 != ';' && (cVar5 != *(char *)(local_c0.field_2._8_8_ + 0x20))))) {
        lVar9 = ::std::__cxx11::string::find
                          ((char)&local_110,
                           (ulong)(uint)(int)*(char *)(local_c0.field_2._8_8_ + 0x24));
        if (lVar9 == -1) {
          detail::trim_copy((string *)local_1c8,&local_110);
          ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_1c8);
          if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(stack0xfffffffffffffe48 + 1));
          }
          local_1c8._0_8_ = local_1c8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"true","");
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158
                     ,local_1c8,&local_1a8);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_110);
          detail::trim_copy((string *)local_1c8,(string *)&local_1a8);
          ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_1c8);
          if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(stack0xfffffffffffffe48 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != &local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            (ulong)(local_198._M_allocated_capacity + 1));
          }
          ::std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_110);
          detail::trim_copy((string *)local_1c8,(string *)&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != &local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            (ulong)(local_198._M_allocated_capacity + 1));
          }
          if (((ulong)local_1c8._8_8_ < (pointer)0x2) ||
             (local_c0.field_2._M_allocated_capacity._4_4_ != (int)*(char *)local_1c8._0_8_)) {
            if ((local_17c & 1) == 0) {
LAB_00118b4e:
              local_1a8._M_allocated_capacity = (size_type)&local_198;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,local_1c8._0_8_,
                         (char *)(local_1c8._0_8_ + (long)(_Alloc_hider *)local_1c8._8_8_));
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_158,&local_1a8,local_188);
              uVar11 = local_198._M_allocated_capacity;
              uVar13 = local_1a8._M_allocated_capacity;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_allocated_capacity != &local_198) {
LAB_00118b92:
                operator_delete((void *)uVar13,
                                (ulong)((long)&(((pointer)uVar11)->_M_dataplus)._M_p + 1));
              }
            }
            else {
              cVar5 = (char)local_114;
              lVar9 = ::std::__cxx11::string::find
                                ((char)local_1c8,(ulong)(uint)(int)(char)local_114);
              if (lVar9 == -1) {
                if (((local_17c & 1) == 0) ||
                   (lVar9 = ::std::__cxx11::string::find((char)local_1c8,0x20), lVar9 == -1))
                goto LAB_00118b4e;
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a0,local_1c8._0_8_,
                           (char *)(local_1c8._0_8_ + (long)(_Alloc_hider *)local_1c8._8_8_));
                detail::split_up(&local_130,&local_a0,'\0');
                local_198._M_allocated_capacity =
                     (size_type)
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1a8._8_8_ =
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_1a8._M_allocated_capacity =
                     (size_type)
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_130.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_130.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_130.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_1a8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_130);
                uVar11 = local_a0.field_2._M_allocated_capacity;
                uVar13 = local_a0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_00118b92;
              }
              else {
                local_80._M_allocated_capacity = (size_type)&local_70;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_80,local_1c8._0_8_,
                           (char *)(local_1c8._0_8_ + (long)(_Alloc_hider *)local_1c8._8_8_));
                detail::split_up(&local_130,(string *)&local_80,cVar5);
                local_198._M_allocated_capacity =
                     (size_type)
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1a8._8_8_ =
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_1a8._M_allocated_capacity =
                     (size_type)
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_130.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_130.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_130.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_130.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_1a8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_130);
                uVar11 = local_70._M_allocated_capacity;
                uVar13 = local_80._M_allocated_capacity;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_allocated_capacity != &local_70) goto LAB_00118b92;
              }
            }
          }
          else {
            local_1a8._M_allocated_capacity = (size_type)&local_198;
            local_1a8._8_8_ = 0;
            local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
            while (local_134 != ((char *)(local_1c8._0_8_ + -1))[local_1c8._8_8_]) {
              cVar5 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + (char)input)
              ;
              piVar7 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 (input,(string *)local_1a8._M_local_buf,cVar5);
              if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
              local_130.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(local_1a8._M_allocated_capacity + local_1a8._8_8_);
              local_60._8_8_ = local_1a8._M_allocated_capacity;
              ::std::
              __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        (&local_60,&local_130,local_60._M_local_buf + 8);
              local_1a8._8_8_ = local_60._M_allocated_capacity - local_1a8._0_8_;
              *(undefined1 *)local_60._M_allocated_capacity = 0;
              _Var8 = ::std::
                      __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                ();
              if ((char *)(local_1a8._M_allocated_capacity + local_1a8._8_8_) == _Var8._M_current) {
                local_1a8._8_8_ = 0;
                *(char *)local_1a8._M_allocated_capacity = '\0';
              }
              else {
                ::std::__cxx11::string::_M_erase((ulong)&local_1a8,0);
              }
              ::std::__cxx11::string::_M_append(local_1c8,local_1a8._M_allocated_capacity);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_allocated_capacity != &local_198) {
              operator_delete((void *)local_1a8._M_allocated_capacity,
                              local_198._M_allocated_capacity + 1);
            }
            ::std::__cxx11::string::substr((ulong)&local_50,(ulong)local_1c8);
            detail::split_up(&local_130,&local_50,(char)local_114);
            local_198._M_allocated_capacity =
                 (size_type)
                 local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1a8._8_8_ =
                 local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_1a8._M_allocated_capacity =
                 (size_type)
                 local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_130.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_130.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_130.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1a8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_130);
            uVar11 = local_50.field_2._M_allocated_capacity;
            uVar13 = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00118b92;
          }
        }
        if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(stack0xfffffffffffffe48 + 1));
        }
        lVar9 = ::std::__cxx11::string::find((char)&local_178,0x2e);
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        if ((((lVar9 == -1) && (1 < local_178._M_string_length)) &&
            ((cVar5 = *local_178._M_dataplus._M_p, cVar5 == '\'' || (cVar5 == '\"')))) &&
           (cVar5 == local_178._M_dataplus._M_p[local_178._M_string_length - 1])) {
          ::std::__cxx11::string::pop_back();
          if (local_178._M_string_length == 1) {
            local_178._M_string_length = 0;
            *local_178._M_dataplus._M_p = '\0';
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            ::std::__cxx11::string::_M_erase((ulong)&local_178,0);
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        for (; paVar14 != paVar15; paVar14 = paVar14 + 2) {
          if (1 < *(ulong *)(paVar14->_M_local_buf + 8)) {
            cVar5 = *(char *)paVar14->_M_allocated_capacity;
            if (((cVar5 == '\'') || (cVar5 == '\"')) &&
               (cVar5 == ((char *)paVar14->_M_allocated_capacity)
                         [*(ulong *)(paVar14->_M_local_buf + 8) - 1])) {
              ::std::__cxx11::string::pop_back();
              if (*(size_type *)(paVar14->_M_local_buf + 8) == 1) {
                *(size_type *)(paVar14->_M_local_buf + 8) = 0;
                **(undefined1 **)paVar14 = 0;
              }
              else {
                ::std::__cxx11::string::_M_erase((ulong)paVar14,0);
              }
            }
          }
        }
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1a8,(string *)&local_f0,&local_178);
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((((__return_storage_ptr__->
              super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
              super__Vector_impl_data._M_start == pCVar2) ||
            (local_178._M_string_length != pCVar2[-1].name._M_string_length)) ||
           (((local_178._M_string_length != 0 &&
             (iVar6 = bcmp(local_178._M_dataplus._M_p,pCVar2[-1].name._M_dataplus._M_p,
                           local_178._M_string_length), iVar6 != 0)) ||
            ((__first2 = pCVar2[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
             local_1a8._8_8_ - local_1a8._0_8_ !=
             (long)pCVar2[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)__first2 ||
             (bVar16 = ::std::__equal<false>::
                       equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a8._M_allocated_capacity,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a8._8_8_,__first2), !bVar16)))))) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                    (__return_storage_ptr__);
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          local_1c8._0_8_ =
               pCVar2[-1].parents.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8._8_8_ =
               pCVar2[-1].parents.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          unique0x10000ccf =
               pCVar2[-1].parents.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pCVar2[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8._M_allocated_capacity;
          pCVar2[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1a8._8_8_;
          pCVar2[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_198._M_allocated_capacity;
          local_1a8._M_allocated_capacity = 0;
          local_1a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_198._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c8);
          ::std::__cxx11::string::operator=
                    ((string *)
                     &(__return_storage_ptr__->
                      super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl
                      .super__Vector_impl_data._M_finish[-1].name,(string *)&local_178);
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          local_1c8._0_8_ =
               pCVar2[-1].inputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8._8_8_ =
               pCVar2[-1].inputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          unique0x10000cef =
               pCVar2[-1].inputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pCVar2[-1].inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pCVar2[-1].inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pCVar2[-1].inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c8);
        }
        else {
          pCVar2 = (__return_storage_ptr__->
                   super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pCVar2[-1].inputs,
                     pCVar2[-1].inputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1a8);
      }
    }
    else {
      iVar6 = ::std::__cxx11::string::compare(local_f0._M_local_buf);
      if (iVar6 != 0) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1a8,(string *)&local_f0,&local_178);
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_1c8._0_8_ =
             pCVar2[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1c8._8_8_ =
             pCVar2[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        unique0x10000b6f =
             pCVar2[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pCVar2[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8._M_allocated_capacity;
        pCVar2[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1a8._8_8_;
        pCVar2[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_198._M_allocated_capacity;
        local_1a8._M_allocated_capacity = 0;
        local_1a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_198._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1a8);
        pCVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pCVar2[-1].name,0,(char *)pCVar2[-1].name._M_string_length,0x16fe41);
      }
      ::std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_110);
      ::std::__cxx11::string::operator=((string *)local_f0._M_local_buf,(string *)local_1c8);
      if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(stack0xfffffffffffffe48 + 1));
      }
      if ((((char *)0x1 < (ulong)local_f0._8_8_) && (*(char *)local_f0._M_allocated_capacity == '[')
          ) && (((char *)(local_f0._M_allocated_capacity - 1))[local_f0._8_8_] == ']')) {
        ::std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_f0);
        ::std::__cxx11::string::operator=((string *)local_f0._M_local_buf,(string *)local_1c8);
        if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(stack0xfffffffffffffe48 + 1));
        }
      }
      local_d0 = &local_c0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_f0._M_allocated_capacity,
                 (char *)(local_f0._8_8_ + local_f0._M_allocated_capacity));
      ::std::
      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                (local_d0,(char *)((long)&(local_c8->_M_dataplus)._M_p +
                                  (long)&(local_d0->_M_dataplus)._M_p),local_d0);
      if (local_d0 == &local_c0) {
        uStack_1b0 = local_c0._M_string_length;
        local_1c8._0_8_ = (pointer)(local_1c8 + 0x10);
      }
      else {
        local_1c8._0_8_ = local_d0;
      }
      uStack_1b7 = local_c0._M_dataplus._M_p._1_7_;
      local_1c8[0x10] = local_c0._M_dataplus._M_p._0_1_;
      local_1c8._8_8_ = local_c8;
      local_c8 = (pointer)0x0;
      local_c0._M_dataplus._M_p._0_1_ = 0;
      local_d0 = &local_c0;
      iVar6 = ::std::__cxx11::string::compare(local_1c8);
      if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(stack0xfffffffffffffe48 + 1));
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_dataplus._M_p._1_7_,
                                          local_c0._M_dataplus._M_p._0_1_) + 1);
      }
      __return_storage_ptr__ = local_140;
      if (iVar6 == 0) {
        ::std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)local_f0._8_8_,0x17100f);
      }
      else {
        detail::checkParentSegments(local_140,(string *)&local_f0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string section = "default";

    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;

    while(getline(input, line)) {
        std::vector<std::string> items_buffer;
        std::string name;

        detail::trim(line);
        std::size_t len = line.length();
        if(len > 1 && line.front() == '[' && line.back() == ']') {
            if(section != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(section, name);
                output.back().name = "--";
            }
            section = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(section.size() > 1 && section.front() == '[' && section.back() == ']') {
                section = section.substr(1, section.size() - 2);
            }
            if(detail::to_lower(section) == "default") {
                section = "default";
            } else {
                detail::checkParentSegments(output, section);
            }
            continue;
        }
        if(len == 0) {
            continue;
        }
        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }

        // Find = in string, split and recombine
        auto pos = line.find(valueDelimiter);
        if(pos != std::string::npos) {
            name = detail::trim_copy(line.substr(0, pos));
            std::string item = detail::trim_copy(line.substr(pos + 1));
            if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item);
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line);
            items_buffer = {"true"};
        }
        if(name.find('.') == std::string::npos) {
            detail::remove_quotes(name);
        }
        // clean up quotes on the items
        for(auto &it : items_buffer) {
            detail::remove_quotes(it);
        }

        std::vector<std::string> parents = detail::generate_parents(section, name);

        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(section != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(section, ename);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}